

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O2

void __thiscall
glcts::SamplerLayoutBindingCase::~SamplerLayoutBindingCase(SamplerLayoutBindingCase *this)

{
  (this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SamplerLayoutBindingCase_01debd50;
  (this->super_LayoutBindingBaseCase).super_IProgramContextSupplier._vptr_IProgramContextSupplier =
       (_func_int **)&PTR__LayoutBindingBaseCase_01debea8;
  LayoutBindingBaseCase::teardownTest(&this->super_LayoutBindingBaseCase);
  std::
  _Rb_tree<int,_std::pair<const_int,_glu::Texture3D_*>,_std::_Select1st<std::pair<const_int,_glu::Texture3D_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture3D_*>_>_>
  ::~_Rb_tree(&(this->super_LayoutBindingBaseCase).m_textures3D._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_glu::Texture2DArray_*>,_std::_Select1st<std::pair<const_int,_glu::Texture2DArray_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture2DArray_*>_>_>
  ::~_Rb_tree(&(this->super_LayoutBindingBaseCase).m_textures2DArray._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_glu::Texture2D_*>,_std::_Select1st<std::pair<const_int,_glu::Texture2D_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture2D_*>_>_>
  ::~_Rb_tree(&(this->super_LayoutBindingBaseCase).m_textures2D._M_t);
  std::
  _Rb_tree<glcts::eStageType,_std::pair<const_glcts::eStageType,_const_char_*>,_std::_Select1st<std::pair<const_glcts::eStageType,_const_char_*>_>,_std::less<glcts::eStageType>,_std::allocator<std::pair<const_glcts::eStageType,_const_char_*>_>_>
  ::~_Rb_tree(&(this->super_LayoutBindingBaseCase).m_templates._M_t);
  std::
  _Rb_tree<glcts::eStageType,_std::pair<const_glcts::eStageType,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_glcts::eStageType,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<glcts::eStageType>,_std::allocator<std::pair<const_glcts::eStageType,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::~_Rb_tree(&(this->super_LayoutBindingBaseCase).m_templateParams._M_t);
  std::
  _Rb_tree<glcts::eStageType,_std::pair<const_glcts::eStageType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_glcts::eStageType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<glcts::eStageType>,_std::allocator<std::pair<const_glcts::eStageType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->super_LayoutBindingBaseCase).m_sources._M_t);
  std::
  _Vector_base<glcts::LayoutBindingBaseCase::LayoutBindingSubTest,_std::allocator<glcts::LayoutBindingBaseCase::LayoutBindingSubTest>_>
  ::~_Vector_base(&(this->super_LayoutBindingBaseCase).m_tests.
                   super__Vector_base<glcts::LayoutBindingBaseCase::LayoutBindingSubTest,_std::allocator<glcts::LayoutBindingBaseCase::LayoutBindingSubTest>_>
                 );
  tcu::TestCase::~TestCase((TestCase *)this);
  return;
}

Assistant:

LayoutBindingBaseCase::~LayoutBindingBaseCase(void)
{
	teardownTest();
}